

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

int math_min(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  lua_Number d;
  double dStack_20;
  int i;
  lua_Number dmin;
  int n;
  lua_State *L_local;
  
  iVar1 = lua_gettop(L);
  dStack_20 = luaL_checknumber(L,1);
  for (d._4_4_ = 2; d._4_4_ <= iVar1; d._4_4_ = d._4_4_ + 1) {
    lVar2 = luaL_checknumber(L,d._4_4_);
    if (lVar2 < dStack_20) {
      dStack_20 = lVar2;
    }
  }
  lua_pushnumber(L,dStack_20);
  return 1;
}

Assistant:

static int math_min (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  lua_Number dmin = luaL_checknumber(L, 1);
  int i;
  for (i=2; i<=n; i++) {
    lua_Number d = luaL_checknumber(L, i);
    if (d < dmin)
      dmin = d;
  }
  lua_pushnumber(L, dmin);
  return 1;
}